

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O0

coda_product_definition *
coda_product_type_get_latest_product_definition(coda_product_type *product_type)

{
  int local_24;
  int local_20;
  int i;
  int max_i;
  int max_version;
  coda_product_type *product_type_local;
  
  if (product_type->num_product_definitions == 0) {
    coda_set_error(-400,"product type %s does not contain any definitions",product_type->name);
    product_type_local = (coda_product_type *)0x0;
  }
  else {
    i = (*product_type->product_definition)->version;
    local_20 = 0;
    for (local_24 = 1; local_24 < product_type->num_product_definitions; local_24 = local_24 + 1) {
      if (i < product_type->product_definition[local_24]->version) {
        i = product_type->product_definition[local_24]->version;
        local_20 = local_24;
      }
    }
    product_type_local = (coda_product_type *)product_type->product_definition[local_20];
  }
  return (coda_product_definition *)product_type_local;
}

Assistant:

coda_product_definition *coda_product_type_get_latest_product_definition(const coda_product_type *product_type)
{
    int max_version;
    int max_i;
    int i;

    if (product_type->num_product_definitions == 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product type %s does not contain any definitions",
                       product_type->name);
        return NULL;
    }
    max_version = product_type->product_definition[0]->version;
    max_i = 0;
    for (i = 1; i < product_type->num_product_definitions; i++)
    {
        if (product_type->product_definition[i]->version > max_version)
        {
            max_version = product_type->product_definition[i]->version;
            max_i = i;
        }
    }

    return product_type->product_definition[max_i];
}